

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrLDA0xb5(CPU *this)

{
  uint8_t argument;
  
  argument = zeropage_x_addr(this);
  LDA(this,argument);
  return 4;
}

Assistant:

int CPU::instrLDA0xb5() {
	LDA(zeropage_x_addr());
	return 4;
}